

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O2

char * FindLatestRazorAHRSSentence(char *sentencebegin,char *str)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  
  pcVar1 = FindRazorAHRSSentence(sentencebegin,str);
  pcVar2 = (char *)0x0;
  while (pcVar1 != (char *)0x0) {
    sVar3 = strlen(sentencebegin);
    pcVar4 = FindRazorAHRSSentence(sentencebegin,pcVar1 + sVar3);
    pcVar2 = pcVar1;
    pcVar1 = pcVar4;
  }
  return pcVar2;
}

Assistant:

inline char* FindLatestRazorAHRSSentence(char* sentencebegin, char* str)
{
	char* ptr = NULL;
	char* foundstr = NULL;

	ptr = FindRazorAHRSSentence(sentencebegin, str);
	while (ptr) 
	{
		// Save the position of the beginning of the sentence.
		foundstr = ptr;

		// Search just after the beginning of the sentence.
		ptr = FindRazorAHRSSentence(sentencebegin, foundstr+strlen(sentencebegin));
	}

	return foundstr;
}